

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8Toisolat1(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  uchar *processed;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  uchar *puVar8;
  byte *pbVar9;
  uint uVar10;
  
  iVar5 = (int)out;
  iVar3 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar6 = in;
      if (0 < (long)*inlen) {
        pbVar7 = in + *inlen;
        puVar8 = out + *outlen;
        do {
          bVar1 = *pbVar6;
          uVar2 = (uint)bVar1;
          lVar4 = 0;
          if ((char)bVar1 < '\0') {
            if (bVar1 < 0xc0) goto LAB_00142b2e;
            if (bVar1 < 0xe0) {
              uVar2 = bVar1 & 0x1f;
              lVar4 = 1;
            }
            else if (bVar1 < 0xf0) {
              uVar2 = bVar1 & 0xf;
              lVar4 = 2;
            }
            else {
              if (0xf7 < bVar1) goto LAB_00142b2e;
              uVar2 = bVar1 & 7;
              lVar4 = 3;
            }
          }
          pbVar9 = pbVar6 + 1;
          iVar3 = (int)lVar4;
          if ((long)pbVar7 - (long)pbVar9 < lVar4) break;
          if (pbVar9 < pbVar7 && (char)bVar1 < '\0') {
            do {
              iVar3 = iVar3 + -1;
              bVar1 = *pbVar9;
              if ((bVar1 & 0xc0) != 0x80) goto LAB_00142b2e;
              pbVar9 = pbVar9 + 1;
              uVar10 = uVar2 << 6;
              uVar2 = bVar1 & 0x3f | uVar10;
            } while ((iVar3 != 0) && (pbVar9 < pbVar7));
            if (0xff < uVar10) {
LAB_00142b2e:
              *outlen = (int)out - iVar5;
              *inlen = (int)pbVar6 - (int)in;
              return -2;
            }
          }
          if (puVar8 <= out) break;
          *out = (uchar)uVar2;
          out = out + 1;
          pbVar6 = pbVar9;
        } while (pbVar9 < pbVar7);
      }
      *outlen = (int)out - iVar5;
      *inlen = (int)pbVar6 - (int)in;
      return *outlen;
    }
    iVar3 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar3;
}

Assistant:

int
UTF8Toisolat1(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + (*inlen);
    outend = out + (*outlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in IsoLat1 */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing) {
	    break;
	}

	for ( ; trailing; trailing--) {
	    if (in >= inend)
		break;
	    if (((d= *in++) & 0xC0) != 0x80) {
		*outlen = out - outstart;
		*inlen = processed - instart;
		return(-2);
	    }
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if (c <= 0xFF) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    /* no chance for this in IsoLat1 */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(*outlen);
}